

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cc
# Opt level: O1

string * ReadFile_abi_cxx11_(string *__return_storage_ptr__,CStringRef name)

{
  ifstream ifs;
  char buffer [4096];
  long local_1230 [4];
  byte abStack_1210 [488];
  undefined1 local_1028 [4104];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::ifstream::ifstream(local_1230,name.data_,_S_in);
  do {
    std::istream::read((char *)local_1230,(long)local_1028);
    std::__cxx11::string::append((char *)__return_storage_ptr__,(ulong)local_1028);
  } while ((abStack_1210[*(long *)(local_1230[0] + -0x18)] & 5) == 0);
  std::ifstream::~ifstream(local_1230);
  return __return_storage_ptr__;
}

Assistant:

std::string ReadFile(fmt::CStringRef name) {
  std::string data;
  std::ifstream ifs(name.c_str());
  enum { BUFFER_SIZE = 4096 };
  char buffer[BUFFER_SIZE];
  do {
    ifs.read(buffer, BUFFER_SIZE);
    data.append(buffer, static_cast<std::string::size_type>(ifs.gcount()));
  } while (ifs);
  return data;
}